

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O3

void __thiscall proto3_unittest::TestAllTypes::clear_oneof_field(TestAllTypes *this)

{
  uint32_t uVar1;
  TestAllTypes_NestedMessage *this_00;
  ulong uVar2;
  
  uVar1 = (this->field_0)._impl_._oneof_case_[0];
  if ((uVar1 == 0x72) || (uVar1 == 0x71)) {
    google::protobuf::internal::ArenaStringPtr::Destroy
              (&(this->field_0)._impl_.oneof_field_.oneof_string_);
  }
  else if (uVar1 == 0x70) {
    uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if ((uVar2 & 1) != 0) {
      uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
    }
    this_00 = *(TestAllTypes_NestedMessage **)((long)&this->field_0 + 0x2a8);
    if (uVar2 == 0) {
      if (this_00 != (TestAllTypes_NestedMessage *)0x0) {
        TestAllTypes_NestedMessage::~TestAllTypes_NestedMessage(this_00);
      }
      operator_delete(this_00,0x20);
    }
    else if (this_00 != (TestAllTypes_NestedMessage *)0x0) {
      (*(this_00->super_Message).super_MessageLite._vptr_MessageLite[2])(this_00);
    }
  }
  (this->field_0)._impl_._oneof_case_[0] = 0;
  return;
}

Assistant:

void TestAllTypes::clear_oneof_field() {
// @@protoc_insertion_point(one_of_clear_start:proto3_unittest.TestAllTypes)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  switch (oneof_field_case()) {
    case kOneofUint32: {
      // No need to clear
      break;
    }
    case kOneofNestedMessage: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.oneof_nested_message_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.oneof_nested_message_);
      }
      break;
    }
    case kOneofString: {
      _impl_.oneof_field_.oneof_string_.Destroy();
      break;
    }
    case kOneofBytes: {
      _impl_.oneof_field_.oneof_bytes_.Destroy();
      break;
    }
    case ONEOF_FIELD_NOT_SET: {
      break;
    }
  }
  _impl_._oneof_case_[0] = ONEOF_FIELD_NOT_SET;
}